

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xsd_generator.cc
# Opt level: O3

string * __thiscall
t_xsd_generator::type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_xsd_generator *this,t_type *ttype)

{
  _func_int **pp_Var1;
  int iVar2;
  long *plVar3;
  undefined4 extraout_var_00;
  t_xsd_generator *this_00;
  string local_60;
  string local_40;
  undefined4 extraout_var;
  
  this_00 = this;
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[9])(ttype);
  pp_Var1 = (ttype->super_t_doc)._vptr_t_doc;
  if ((char)iVar2 == '\0') {
    iVar2 = (*pp_Var1[5])(ttype);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
      if ((char)iVar2 == '\0') {
        iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
        if (((char)iVar2 == '\0') &&
           (iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype), (char)iVar2 == '\0')) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"container","");
          return __return_storage_ptr__;
        }
        iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
        plVar3 = (long *)CONCAT44(extraout_var_00,iVar2);
        goto LAB_00369fce;
      }
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"int","");
      xsd(__return_storage_ptr__,this,&local_60);
      local_40._M_dataplus._M_p = local_60._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p == &local_60.field_2) {
        return __return_storage_ptr__;
      }
    }
    else {
      base_type_name_abi_cxx11_(&local_40,this_00,*(t_base *)&ttype[1].super_t_doc._vptr_t_doc);
      xsd(__return_storage_ptr__,this,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p == &local_40.field_2) {
        return __return_storage_ptr__;
      }
    }
    operator_delete(local_40._M_dataplus._M_p);
  }
  else {
    iVar2 = (*pp_Var1[3])(ttype);
    plVar3 = (long *)CONCAT44(extraout_var,iVar2);
LAB_00369fce:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*plVar3,plVar3[1] + *plVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_xsd_generator::type_name(t_type* ttype) {
  if (ttype->is_typedef()) {
    return ttype->get_name();
  }

  if (ttype->is_base_type()) {
    return xsd(base_type_name(((t_base_type*)ttype)->get_base()));
  }

  if (ttype->is_enum()) {
    return xsd("int");
  }

  if (ttype->is_struct() || ttype->is_xception()) {
    return ttype->get_name();
  }

  return "container";
}